

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

uint * Ivy_ManCutTruth(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,
                      Vec_Int_t *vTruth)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  uint *puVar3;
  long lVar4;
  int local_34;
  int Leaf;
  int i;
  Vec_Int_t *vTruth_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  Ivy_ManCollectCut(p,pRoot,vLeaves,vNodes);
  for (local_34 = 0; iVar1 = Vec_IntSize(vNodes), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_34);
    pIVar2 = Ivy_ManObj(p,iVar1);
    pIVar2->TravId = local_34;
  }
  Vec_IntClear(vTruth);
  iVar1 = Vec_IntSize(vNodes);
  Vec_IntGrow(vTruth,iVar1 << 3);
  for (local_34 = 0; iVar1 = Vec_IntSize(vLeaves), local_34 < iVar1; local_34 = local_34 + 1) {
    Vec_IntEntry(vLeaves,local_34);
    puVar3 = Ivy_ObjGetTruthStore(local_34,vTruth);
    lVar4 = (long)local_34;
    *(undefined8 *)puVar3 = *(undefined8 *)Ivy_ManCutTruth::uTruths[lVar4];
    *(undefined8 *)(puVar3 + 2) = *(undefined8 *)(Ivy_ManCutTruth::uTruths[lVar4] + 2);
    *(undefined8 *)(puVar3 + 4) = *(undefined8 *)(Ivy_ManCutTruth::uTruths[lVar4] + 4);
    *(undefined8 *)(puVar3 + 6) = *(undefined8 *)(Ivy_ManCutTruth::uTruths[lVar4] + 6);
  }
  for (local_34 = Vec_IntSize(vLeaves); iVar1 = Vec_IntSize(vNodes), local_34 < iVar1;
      local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_34);
    pIVar2 = Ivy_ManObj(p,iVar1);
    Ivy_ManCutTruthOne(p,pIVar2,vTruth,8);
  }
  puVar3 = Ivy_ObjGetTruthStore(pRoot->TravId,vTruth);
  return puVar3;
}

Assistant:

unsigned * Ivy_ManCutTruth( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Int_t * vTruth )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    int i, Leaf;
    // collect the cut
    Ivy_ManCollectCut( p, pRoot, vLeaves, vNodes );
    // set the node numbers
    Vec_IntForEachEntry( vNodes, Leaf, i )
        Ivy_ManObj(p, Leaf)->TravId = i;
    // alloc enough memory
    Vec_IntClear( vTruth );
    Vec_IntGrow( vTruth, 8 * Vec_IntSize(vNodes) );
    // set the elementary truth tables
    Vec_IntForEachEntry( vLeaves, Leaf, i )
        memcpy( Ivy_ObjGetTruthStore(i, vTruth), uTruths[i], 8 * sizeof(unsigned) );
    // compute truths for other nodes
    Vec_IntForEachEntryStart( vNodes, Leaf, i, Vec_IntSize(vLeaves) )
        Ivy_ManCutTruthOne( p, Ivy_ManObj(p, Leaf), vTruth, 8 );
    return Ivy_ObjGetTruthStore( pRoot->TravId, vTruth );
}